

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall
asl::String::replace(String *__return_storage_ptr__,String *this,String *a,String *b)

{
  int iVar1;
  char *pcVar2;
  int local_60;
  int i;
  String local_50;
  undefined1 local_31;
  int local_30;
  int local_2c;
  int m;
  int j;
  String *b_local;
  String *a_local;
  String *this_local;
  String *out;
  
  _m = b;
  b_local = a;
  a_local = this;
  this_local = __return_storage_ptr__;
  local_2c = indexOf(this,a,0);
  local_30 = length(b_local);
  if (local_2c == -1) {
    String(__return_storage_ptr__,this);
  }
  else {
    local_31 = 0;
    iVar1 = length(this);
    String(__return_storage_ptr__,iVar1,0);
    substring(&local_50,this,0,local_2c);
    operator<<(__return_storage_ptr__,&local_50);
    ~String(&local_50);
    local_60 = local_2c + local_30;
    while (iVar1 = length(this), local_60 <= iVar1) {
      local_2c = indexOf(this,b_local,local_60);
      if (local_2c == -1) {
        local_2c = length(this);
      }
      operator<<(__return_storage_ptr__,_m);
      pcVar2 = str(this);
      append(__return_storage_ptr__,pcVar2 + local_60,local_2c - local_60);
      local_60 = local_2c + local_30;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String String::replace(const String& a, const String& b) const
{
	int j = indexOf(a), m = a.length();
	if(j==-1)
		return *this;
	String out(length(), 0);
	out << substring(0, j);
	for(int i=j+m; i<=length(); i=j+m)
	{
		j = indexOf(a, i);
		if(j==-1) j=length();
		out << b;
		out.append(str() + i, j - i);
	}
	return out;
}